

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O2

REF_STATUS
ref_facelift_edge_face_watertight
          (REF_FACELIFT ref_facelift,REF_INT edgeid,REF_INT faceid,REF_INT sense,REF_DBL t,
          REF_DBL *uv)

{
  REF_GEOM pRVar1;
  double dVar2;
  uint uVar3;
  undefined8 uVar4;
  ulong uVar5;
  char *pcVar6;
  double dVar7;
  REF_INT geom;
  REF_GEOM local_160;
  REF_DBL t_local;
  double local_150;
  REF_INT local_144;
  REF_INT tri_cell;
  REF_INT edg_cell;
  REF_DBL facexyz [3];
  REF_DBL edgexyz [3];
  REF_DBL tri_bary [3];
  REF_DBL edg_bary [3];
  REF_INT nodes [27];
  
  t_local = t;
  if (sense != 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x319,"ref_facelift_edge_face_watertight","implement sense != 0 for uv jumps");
    return 1;
  }
  pRVar1 = ref_facelift->grid->geom;
  uVar3 = ref_facelift_eval_at(ref_facelift,1,edgeid,&t_local,edgexyz,(REF_DBL *)0x0);
  if (uVar3 != 0) {
    uVar5 = (ulong)uVar3;
    pcVar6 = "eval edge";
    uVar4 = 0x31d;
    goto LAB_0018b21e;
  }
  local_160 = pRVar1;
  uVar3 = ref_facelift_eval_at(ref_facelift,2,faceid,uv,facexyz,(REF_DBL *)0x0);
  if (uVar3 == 0) {
    local_150 = SQRT((facexyz[2] - edgexyz[2]) * (facexyz[2] - edgexyz[2]) +
                     (facexyz[1] - edgexyz[1]) * (facexyz[1] - edgexyz[1]) +
                     (facexyz[0] - edgexyz[0]) * (facexyz[0] - edgexyz[0]));
    dVar7 = SQRT(t_local * t_local +
                 uv[1] * uv[1] +
                 *uv * *uv +
                 edgexyz[2] * edgexyz[2] + edgexyz[0] * edgexyz[0] + edgexyz[1] * edgexyz[1]);
    dVar2 = (double)(~-(ulong)(1.0 < dVar7) & 0x3ddb7cdfd9d7bdbb |
                    (ulong)(dVar7 * 1e-10) & -(ulong)(1.0 < dVar7));
    if (local_150 <= dVar2) {
      return 0;
    }
    uVar3 = ref_facelift_enclosing(ref_facelift,1,edgeid,&t_local,&edg_cell,edg_bary);
    if (uVar3 == 0) {
      if (edg_cell == -1) {
        pcVar6 = "no enclosing found";
        uVar4 = 0x330;
      }
      else {
        local_144 = edg_cell;
        uVar3 = ref_facelift_enclosing(ref_facelift,2,faceid,uv,&tri_cell,tri_bary);
        if (uVar3 != 0) {
          pcVar6 = "enclose";
          uVar4 = 0x333;
          goto LAB_0018b271;
        }
        if (tri_cell != -1) {
          printf("edge %d t %f dist %e tol %e len %e\n",t_local,local_150,dVar2,dVar7,
                 (ulong)(uint)edgeid);
          printf("face %d uv %f %f\n",*uv,uv[1],(ulong)(uint)faceid);
          printf("edge xyz %e %e %e\n",edgexyz[0],edgexyz[1],edgexyz[2]);
          printf("face xyz %e %e %e\n",facexyz[0],facexyz[1],facexyz[2]);
          printf("edg bary %f %f %f\n",edg_bary[0],edg_bary[1],edg_bary[2]);
          printf("tri bary %f %f %f\n",tri_bary[0],tri_bary[1],tri_bary[2]);
          uVar3 = ref_cell_nodes(ref_facelift->edg_cell,local_144,nodes);
          pRVar1 = local_160;
          if (uVar3 == 0) {
            uVar3 = ref_geom_find(local_160,nodes[0],1,edgeid,&geom);
            if (uVar3 == 0) {
              local_150 = (double)CONCAT44(local_150._4_4_,tri_cell);
              printf("t0 %f\n",pRVar1->param[(long)geom * 2]);
              uVar3 = ref_geom_find(pRVar1,nodes[1],1,edgeid,&geom);
              if (uVar3 == 0) {
                printf("t1 %f\n",pRVar1->param[(long)geom * 2]);
                uVar3 = ref_geom_find(pRVar1,nodes[0],2,faceid,&geom);
                pRVar1 = local_160;
                if (uVar3 == 0) {
                  printf("uv0 %f %f along\n",local_160->param[(long)geom * 2],
                         local_160->param[geom * 2 + 1]);
                  uVar3 = ref_geom_find(pRVar1,nodes[1],2,faceid,&geom);
                  if (uVar3 == 0) {
                    printf("uv1 %f %f along\n",local_160->param[(long)geom * 2],
                           local_160->param[geom * 2 + 1]);
                    uVar3 = ref_cell_nodes(ref_facelift->tri_cell,local_150._0_4_,nodes);
                    if (uVar3 == 0) {
                      uVar3 = ref_geom_find(local_160,nodes[0],2,faceid,&geom);
                      pRVar1 = local_160;
                      if (uVar3 == 0) {
                        printf("uv0 %f %f\n",local_160->param[(long)geom * 2],
                               local_160->param[geom * 2 + 1]);
                        uVar3 = ref_geom_find(pRVar1,nodes[1],2,faceid,&geom);
                        pRVar1 = local_160;
                        if (uVar3 == 0) {
                          printf("uv1 %f %f\n",local_160->param[(long)geom * 2],
                                 local_160->param[geom * 2 + 1]);
                          uVar3 = ref_geom_find(pRVar1,nodes[2],2,faceid,&geom);
                          if (uVar3 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                   ,0x354,"ref_facelift_edge_face_watertight",(ulong)uVar3,"gm");
                            return uVar3;
                          }
                          printf("uv2 %f %f\n",local_160->param[(long)geom * 2],
                                 local_160->param[geom * 2 + 1]);
                          pcVar6 = "not watertight within tol";
                          uVar4 = 0x358;
                          goto LAB_0018b42c;
                        }
                        pcVar6 = "gm";
                        uVar4 = 0x351;
                      }
                      else {
                        pcVar6 = "gm";
                        uVar4 = 0x34e;
                      }
                    }
                    else {
                      pcVar6 = "nodes";
                      uVar4 = 0x34d;
                    }
                  }
                  else {
                    pcVar6 = "gm";
                    uVar4 = 0x348;
                  }
                }
                else {
                  pcVar6 = "gm";
                  uVar4 = 0x345;
                }
              }
              else {
                pcVar6 = "gm";
                uVar4 = 0x342;
              }
              goto LAB_0018b271;
            }
            uVar5 = (ulong)uVar3;
            pcVar6 = "gm";
            uVar4 = 0x340;
          }
          else {
            uVar5 = (ulong)uVar3;
            pcVar6 = "nodes";
            uVar4 = 0x33f;
          }
LAB_0018b21e:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,uVar4,"ref_facelift_edge_face_watertight",uVar5,pcVar6);
          return (REF_STATUS)uVar5;
        }
        pcVar6 = "no enclosing found";
        uVar4 = 0x334;
      }
LAB_0018b42c:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             uVar4,"ref_facelift_edge_face_watertight",pcVar6);
      return 1;
    }
    pcVar6 = "enclose";
    uVar4 = 0x32f;
  }
  else {
    pcVar6 = "eval face";
    uVar4 = 800;
  }
LAB_0018b271:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar4,
         "ref_facelift_edge_face_watertight",(ulong)uVar3,pcVar6);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_edge_face_watertight(REF_FACELIFT ref_facelift,
                                                     REF_INT edgeid,
                                                     REF_INT faceid,
                                                     REF_INT sense, REF_DBL t,
                                                     REF_DBL *uv) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_DBL edgexyz[3], facexyz[3], dist;
  REF_DBL len, tol;
  RAS(0 == sense, "implement sense != 0 for uv jumps");

  RSS(ref_facelift_eval_at(ref_facelift, REF_GEOM_EDGE, edgeid, &t, edgexyz,
                           NULL),
      "eval edge");
  RSS(ref_facelift_eval_at(ref_facelift, REF_GEOM_FACE, faceid, uv, facexyz,
                           NULL),
      "eval face");
  dist =
      sqrt(pow(facexyz[0] - edgexyz[0], 2) + pow(facexyz[1] - edgexyz[1], 2) +
           pow(facexyz[2] - edgexyz[2], 2));
  tol = 1.0e-10; /* increase tol if not O(1) */
  len = sqrt(ref_math_dot(edgexyz, edgexyz) + uv[0] * uv[0] + uv[1] * uv[1] +
             t * t);
  if (len > 1.0) tol = tol * len;
  if (dist > tol) {
    REF_INT edg_cell, tri_cell;
    REF_DBL edg_bary[3], tri_bary[3];
    REF_INT nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT geom;
    RSS(ref_facelift_enclosing(ref_facelift, REF_GEOM_EDGE, edgeid, &t,
                               &edg_cell, edg_bary),
        "enclose");
    RUS(REF_EMPTY, edg_cell, "no enclosing found");
    RSS(ref_facelift_enclosing(ref_facelift, REF_GEOM_FACE, faceid, uv,
                               &tri_cell, tri_bary),
        "enclose");
    RUS(REF_EMPTY, tri_cell, "no enclosing found");

    printf("edge %d t %f dist %e tol %e len %e\n", edgeid, t, dist, tol, len);
    printf("face %d uv %f %f\n", faceid, uv[0], uv[1]);
    printf("edge xyz %e %e %e\n", edgexyz[0], edgexyz[1], edgexyz[2]);
    printf("face xyz %e %e %e\n", facexyz[0], facexyz[1], facexyz[2]);

    printf("edg bary %f %f %f\n", edg_bary[0], edg_bary[1], edg_bary[2]);
    printf("tri bary %f %f %f\n", tri_bary[0], tri_bary[1], tri_bary[2]);

    RSS(ref_cell_nodes(ref_facelift_edg(ref_facelift), edg_cell, nodes),
        "nodes");
    RSS(ref_geom_find(ref_geom, nodes[0], REF_GEOM_EDGE, edgeid, &geom), "gm");
    printf("t0 %f\n", ref_geom_param(ref_geom, 0, geom));
    RSS(ref_geom_find(ref_geom, nodes[1], REF_GEOM_EDGE, edgeid, &geom), "gm");
    printf("t1 %f\n", ref_geom_param(ref_geom, 0, geom));

    RSS(ref_geom_find(ref_geom, nodes[0], REF_GEOM_FACE, faceid, &geom), "gm");
    printf("uv0 %f %f along\n", ref_geom_param(ref_geom, 0, geom),
           ref_geom_param(ref_geom, 1, geom));
    RSS(ref_geom_find(ref_geom, nodes[1], REF_GEOM_FACE, faceid, &geom), "gm");
    printf("uv1 %f %f along\n", ref_geom_param(ref_geom, 0, geom),
           ref_geom_param(ref_geom, 1, geom));

    RSS(ref_cell_nodes(ref_facelift_tri(ref_facelift), tri_cell, nodes),
        "nodes");
    RSS(ref_geom_find(ref_geom, nodes[0], REF_GEOM_FACE, faceid, &geom), "gm");
    printf("uv0 %f %f\n", ref_geom_param(ref_geom, 0, geom),
           ref_geom_param(ref_geom, 1, geom));
    RSS(ref_geom_find(ref_geom, nodes[1], REF_GEOM_FACE, faceid, &geom), "gm");
    printf("uv1 %f %f\n", ref_geom_param(ref_geom, 0, geom),
           ref_geom_param(ref_geom, 1, geom));
    RSS(ref_geom_find(ref_geom, nodes[2], REF_GEOM_FACE, faceid, &geom), "gm");
    printf("uv2 %f %f\n", ref_geom_param(ref_geom, 0, geom),
           ref_geom_param(ref_geom, 1, geom));

    THROW("not watertight within tol");
  }
  return REF_SUCCESS;
}